

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Optional<Catch::ReporterSpec> *
Catch::parseReporterSpec
          (Optional<Catch::ReporterSpec> *__return_storage_ptr__,StringRef reporterSpec)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  size_type in_RCX;
  char *pcVar4;
  ulong uVar5;
  StringRef other;
  StringRef other_00;
  StringRef reporterSpec_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar6;
  StringRef colourMode;
  long local_230;
  char *local_228;
  char local_220 [8];
  StringRef value;
  StringRef key;
  Optional<Catch::ColourMode> local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outputFileName;
  string local_1a0;
  string local_180;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  kvPairs;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  kvPair kv;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  string local_50;
  
  reporterSpec_00.m_start = (char *)reporterSpec.m_size;
  reporterSpec_00.m_size = in_RCX;
  Detail::splitReporterSpec_abi_cxx11_(&parts,(Detail *)reporterSpec.m_start,reporterSpec_00);
  kvPairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &kvPairs._M_t._M_impl.super__Rb_tree_header._M_header;
  kvPairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  kvPairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  kvPairs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outputFileName.nullableValue =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228 = (char *)0x0;
  uVar5 = 1;
  local_230 = 0x28;
  kvPairs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       kvPairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((ulong)((long)parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)parts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) {
      std::__cxx11::string::string
                ((string *)&local_1a0,
                 (string *)
                 parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Optional(&local_130,&outputFileName);
      if (local_228 == (char *)0x0) {
        local_1f0.nullableValue = (ColourMode *)0x0;
      }
      else {
        local_1f0.nullableValue = (ColourMode *)local_1f0.storage;
        local_1f0.storage[0] = *local_228;
      }
      std::_Rb_tree_header::_Rb_tree_header
                (&local_80._M_impl.super__Rb_tree_header,&kvPairs._M_t._M_impl.super__Rb_tree_header
                );
      ReporterSpec::ReporterSpec
                ((ReporterSpec *)&kv,&local_1a0,&local_130,&local_1f0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_80);
      Optional<Catch::ReporterSpec>::Optional(__return_storage_ptr__,(ReporterSpec *)&kv);
      ReporterSpec::~ReporterSpec((ReporterSpec *)&kv);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_80);
      local_1f0.nullableValue = (ColourMode *)0x0;
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_130);
      std::__cxx11::string::~string((string *)&local_1a0);
LAB_00131d80:
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&outputFileName);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&kvPairs._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
      return __return_storage_ptr__;
    }
    pcVar4 = *(char **)((long)parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_230 + -8);
    uVar1 = *(ulong *)((long)&((parts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_230);
    local_180._M_dataplus._M_p._0_1_ = 0x3d;
    pcVar3 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (pcVar4,pcVar4 + uVar1,&local_180);
    key.m_size = (long)pcVar3 - (long)pcVar4;
    value.m_size = uVar1 - (key.m_size + 1);
    if (uVar1 <= value.m_size) {
      value.m_size = uVar1;
    }
    if (key.m_size + 1 < uVar1) {
      value.m_start = pcVar3 + 1;
    }
    else {
      value.m_size = 0;
      value.m_start = "";
    }
    if (uVar1 < key.m_size) {
      key.m_size = uVar1;
    }
    if (uVar1 == 0) {
      pcVar4 = "";
      key.m_size = uVar1;
    }
    key.m_start = pcVar4;
    kv.key.m_start = pcVar4;
    kv.key.m_size = key.m_size;
    kv.value.m_start = value.m_start;
    kv.value.m_size = value.m_size;
    if ((key.m_size == 0) || (value.m_size == 0)) {
LAB_00131cb1:
      __return_storage_ptr__->nullableValue = (ReporterSpec *)0x0;
      goto LAB_00131d80;
    }
    if (*pcVar4 == 'X') {
      if (key.m_size != 1) {
        StringRef::operator_cast_to_string(&local_180,&kv.key);
        StringRef::operator_cast_to_string(&local_50,&kv.value);
        pVar6 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&kvPairs,&local_180,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_180);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00131ca3;
      }
      goto LAB_00131cb1;
    }
    other.m_size = 3;
    other.m_start = "out";
    bVar2 = StringRef::operator==(&key,other);
    if (!bVar2) {
      other_00.m_size = 0xb;
      other_00.m_start = "colour-mode";
      bVar2 = StringRef::operator==(&key,other_00);
      if ((bVar2) && (local_228 == (char *)0x0)) {
        colourMode.m_size = (size_type)value.m_start;
        colourMode.m_start = (char *)&local_180;
        Detail::stringToColourMode(colourMode);
        if ((char *)CONCAT71(local_180._M_dataplus._M_p._1_7_,local_180._M_dataplus._M_p._0_1_) !=
            (char *)0x0) {
          local_220[0] = *(char *)CONCAT71(local_180._M_dataplus._M_p._1_7_,
                                           local_180._M_dataplus._M_p._0_1_);
          local_228 = local_220;
          goto LAB_00131ca3;
        }
      }
      goto LAB_00131cb1;
    }
    if (outputFileName.nullableValue !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00131cb1;
    StringRef::operator_cast_to_string(&local_180,&value);
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&outputFileName,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
LAB_00131ca3:
    uVar5 = uVar5 + 1;
    local_230 = local_230 + 0x20;
  } while( true );
}

Assistant:

Optional<ReporterSpec> parseReporterSpec( StringRef reporterSpec ) {
        auto parts = Detail::splitReporterSpec( reporterSpec );

        assert( parts.size() > 0 && "Split should never return empty vector" );

        std::map<std::string, std::string> kvPairs;
        Optional<std::string> outputFileName;
        Optional<ColourMode> colourMode;

        // First part is always reporter name, so we skip it
        for ( size_t i = 1; i < parts.size(); ++i ) {
            auto kv = splitKVPair( parts[i] );
            auto key = kv.key, value = kv.value;

            if ( key.empty() || value.empty() ) { // NOLINT(bugprone-branch-clone)
                return {};
            } else if ( key[0] == 'X' ) {
                // This is a reporter-specific option, we don't check these
                // apart from basic sanity checks
                if ( key.size() == 1 ) {
                    return {};
                }

                auto ret = kvPairs.emplace( std::string(kv.key), std::string(kv.value) );
                if ( !ret.second ) {
                    // Duplicated key. We might want to handle this differently,
                    // e.g. by overwriting the existing value?
                    return {};
                }
            } else if ( key == "out" ) {
                // Duplicated key
                if ( outputFileName ) {
                    return {};
                }
                outputFileName = static_cast<std::string>( value );
            } else if ( key == "colour-mode" ) {
                // Duplicated key
                if ( colourMode ) {
                    return {};
                }
                colourMode = Detail::stringToColourMode( value );
                // Parsing failed
                if ( !colourMode ) {
                    return {};
                }
            } else {
                // Unrecognized option
                return {};
            }
        }

        return ReporterSpec{ CATCH_MOVE( parts[0] ),
                             CATCH_MOVE( outputFileName ),
                             CATCH_MOVE( colourMode ),
                             CATCH_MOVE( kvPairs ) };
    }